

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_gen.c
# Opt level: O3

void pk_retrieve_8cols(uchar *cols_out,uint col,uchar *inv,gf *g,gf *L)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  gf in;
  ushort uVar9;
  int i;
  int iVar10;
  uint uVar11;
  int iVar12;
  uchar *puVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar21;
  undefined1 auVar20 [16];
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  uchar cols_hat_H [96];
  uchar tmp [768];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  byte abStack_338 [96];
  byte abStack_2d8 [96];
  byte abStack_278 [96];
  byte abStack_218 [96];
  byte abStack_1b8 [96];
  byte abStack_158 [96];
  byte abStack_f8 [96];
  byte abStack_98 [104];
  
  lVar14 = 0;
  do {
    uVar11 = (int)lVar14 + col ^ 7;
    in = eval(g,L[uVar11]);
    uVar9 = gf_inv(in);
    local_398 = (undefined1  [16])0x0;
    local_388 = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_368 = (undefined1  [16])0x0;
    local_358 = (undefined1  [16])0x0;
    local_348 = (undefined1  [16])0x0;
    lVar15 = 8;
    lVar17 = 0;
    bVar16 = 0;
    iVar12 = 0;
    do {
      iVar10 = 0;
      do {
        if (lVar15 == 0) {
          local_398[lVar17] = bVar16;
          lVar17 = lVar17 + 1;
          lVar15 = 8;
          bVar16 = 0;
        }
        bVar16 = bVar16 >> 1 | (char)(uVar9 >> ((byte)iVar10 & 0x1f)) << 7;
        lVar15 = lVar15 + -1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0xc);
      uVar9 = gf_mul(uVar9,L[uVar11]);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0x40);
    if (lVar15 == 0) {
      local_398[lVar17] = bVar16;
    }
    lVar15 = lVar14 * 0x60;
    *(undefined1 (*) [16])(abStack_2d8 + lVar15 + -0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(abStack_2d8 + lVar15 + -0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(abStack_338 + lVar15 + 0x30) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(abStack_338 + lVar15 + 0x20) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(abStack_338 + lVar15 + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(abStack_338 + lVar15) = (undefined1  [16])0x0;
    uVar11 = 0;
    puVar13 = inv;
    do {
      auVar18 = (undefined1  [16])0x0;
      lVar17 = 0;
      do {
        auVar18 = auVar18 ^ *(undefined1 (*) [16])(puVar13 + lVar17) &
                            *(undefined1 (*) [16])(local_398 + lVar17);
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x60);
      auVar20._0_8_ = auVar18._8_8_;
      auVar20._8_4_ = auVar18._8_4_;
      auVar20._12_4_ = auVar18._12_4_;
      uVar21 = SUB164(auVar20 ^ auVar18,4);
      auVar19._4_4_ = uVar21;
      auVar19._0_4_ = uVar21;
      auVar19._8_4_ = uVar21;
      auVar19._12_4_ = uVar21;
      auVar19 = auVar19 ^ auVar20 ^ auVar18;
      auVar18._0_4_ = auVar19._0_4_ >> 0x10;
      auVar18._4_4_ = 0;
      auVar18._8_4_ = auVar19._8_4_ >> 0x10;
      auVar18._12_4_ = auVar19._12_4_ >> 0x10;
      bVar16 = SUB161(auVar18 ^ auVar19,1) ^ SUB161(auVar18 ^ auVar19,0);
      bVar16 = bVar16 >> 4 ^ bVar16;
      bVar16 = bVar16 >> 2 ^ bVar16;
      pbVar1 = *(undefined1 (*) [16])(abStack_338 + lVar15) + (uVar11 >> 3);
      *pbVar1 = *pbVar1 | ((bVar16 >> 1 ^ bVar16) & 1) << ((byte)uVar11 & 7);
      puVar13 = puVar13 + 0x60;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x300);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  lVar14 = 0;
  do {
    bVar16 = abStack_98[lVar14];
    bVar2 = abStack_f8[lVar14];
    bVar3 = abStack_158[lVar14];
    bVar4 = abStack_1b8[lVar14];
    bVar5 = abStack_218[lVar14];
    bVar6 = abStack_278[lVar14];
    bVar7 = abStack_2d8[lVar14];
    bVar8 = abStack_338[lVar14];
    uVar9 = bVar16 >> 4 & 1 | bVar2 >> 3 & 2 |
            (bVar3 >> 4 & 1 | bVar4 >> 3 & 2 |
            (bVar5 >> 4 & 1 | bVar6 >> 3 & 2 | (bVar7 >> 4 & 1 | bVar8 >> 3 & 2) << 2) << 2) << 2;
    uVar22 = bVar16 >> 5 & 1 | bVar2 >> 4 & 2 |
             (bVar3 >> 5 & 1 | bVar4 >> 4 & 2 |
             (bVar5 >> 5 & 1 | bVar6 >> 4 & 2 | (bVar7 >> 5 & 1 | bVar8 >> 4 & 2) << 2) << 2) << 2;
    uVar23 = bVar16 >> 6 & 1 | bVar2 >> 5 & 2 |
             (bVar3 >> 6 & 1 | bVar4 >> 5 & 2 |
             (bVar5 >> 6 & 1 | bVar6 >> 5 & 2 | (bVar7 >> 6 & 1 | bVar8 >> 5 & 2) << 2) << 2) << 2;
    uVar24 = (ushort)(bVar16 >> 7) | bVar2 >> 6 & 2 |
             ((ushort)(bVar3 >> 7) | bVar4 >> 6 & 2 |
             ((ushort)(bVar5 >> 7) | bVar6 >> 6 & 2 | ((ushort)(bVar7 >> 7) | bVar8 >> 6 & 2) << 2)
             << 2) << 2;
    uVar25 = bVar16 & 1 | (ushort)bVar2 * 2 & 2 |
             (bVar3 & 1 | (ushort)bVar4 * 2 & 2 |
             (bVar5 & 1 | (ushort)bVar6 * 2 & 2 | (bVar7 & 1 | (ushort)bVar8 * 2 & 2) << 2) << 2) <<
             2;
    uVar26 = bVar16 >> 1 & 1 | (ushort)(bVar2 >> 1) * 2 & 2 |
             (bVar3 >> 1 & 1 | (ushort)(bVar4 >> 1) * 2 & 2 |
             (bVar5 >> 1 & 1 | (ushort)(bVar6 >> 1) * 2 & 2 |
             (bVar7 >> 1 & 1 | (ushort)(bVar8 >> 1) * 2 & 2) << 2) << 2) << 2;
    uVar27 = bVar16 >> 2 & 1 | (ushort)(bVar2 >> 2) * 2 & 2 |
             (bVar3 >> 2 & 1 | (ushort)(bVar4 >> 2) * 2 & 2 |
             (bVar5 >> 2 & 1 | (ushort)(bVar6 >> 2) * 2 & 2 |
             (bVar7 >> 2 & 1 | (ushort)(bVar8 >> 2) * 2 & 2) << 2) << 2) << 2;
    uVar28 = bVar16 >> 3 & 1 | (ushort)(bVar2 >> 3) * 2 & 2 |
             (bVar3 >> 3 & 1 | (ushort)(bVar4 >> 3) * 2 & 2 |
             (bVar5 >> 3 & 1 | (ushort)(bVar6 >> 3) * 2 & 2 |
             (bVar7 >> 3 & 1 | (ushort)(bVar8 >> 3) * 2 & 2) << 2) << 2) << 2;
    bVar16 = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    bVar2 = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    bVar3 = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    bVar4 = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    bVar5 = (uVar9 != 0) * (uVar9 < 0x100) * (char)uVar9 - (0xff < uVar9);
    bVar6 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    bVar7 = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    bVar8 = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    *(ulong *)(cols_out + lVar14 * 8) =
         CONCAT17((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                  CONCAT16((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                           CONCAT15((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT14((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                       (0xff < bVar4),
                                                       CONCAT12((bVar3 != 0) * (bVar3 < 0x100) *
                                                                bVar3 - (0xff < bVar3),
                                                                CONCAT11((bVar2 != 0) *
                                                                         (bVar2 < 0x100) * bVar2 -
                                                                         (0xff < bVar2),
                                                                         (bVar16 != 0) *
                                                                         (bVar16 < 0x100) * bVar16 -
                                                                         (0xff < bVar16))))))));
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x60);
  return;
}

Assistant:

void pk_retrieve_8cols(unsigned char *cols_out, unsigned int col, unsigned char *inv, gf *g, gf *L)
{
  unsigned char b;
  unsigned char tmp[SYS_T * GFBITS];
  unsigned char cols_hat_H[SYS_T * GFBITS/8];

  // compute 8 columns of \hat{H} and multiply by the inverse to obtain the pubkey columns
  for(int j = 0; j < 8; j++)
  {
    gen_hat_H_col(cols_hat_H, col+j, g, L);
    mat_vec_mul(tmp + (SYS_T*GFBITS/8) * j, inv, SYS_T * GFBITS, SYS_T * GFBITS, cols_hat_H);
  }

  // reassamble the 8 bit columns into the corresponding bytes
  for(int i = 0; i < SYS_T*GFBITS/8; i++)
    for(int j = 0; j < 8; j++)
    {
      b  = (tmp[SYS_T*GFBITS/8 * 0 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 1 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 2 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 3 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 4 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 5 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 6 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 7 + i] >> j) & 1;

      cols_out[i*8 + j] = b;
    }
}